

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O2

void __thiscall imrt::Ant::printReferencePlan(Ant *this)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  int i;
  long lVar4;
  long lVar5;
  int local_3c;
  long local_38;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Reference plan:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar5 = 0;
  while (lVar5 < this->n_stations) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Station");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_38 = lVar5;
    for (local_3c = 0; local_3c < this->n_apertures; local_3c = local_3c + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Aperture ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_3c);
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar4 = 0;
      while( true ) {
        iVar1 = Collimator::getXdim(this->collimator);
        if (iVar1 <= lVar4) break;
        pmVar3 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((this->ref_plan).
                              super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_3c);
        poVar2 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar4]);
        std::endl<char,std::char_traits<char>>(poVar2);
        lVar4 = lVar4 + 1;
      }
    }
    lVar5 = local_38 + 1;
  }
  return;
}

Assistant:

void Ant::printReferencePlan() {
    cout << "--------------------------------------------"<< endl;
    cout << "Reference plan:" << endl;
    cout << "--------------------------------------------"<< endl;
    for (int s=0; s<n_stations; s++) {
      cout << "Station" << s << endl;
      for (int a=0; a<n_apertures; a++) {
        cout << "Aperture " << a << endl;
        for (int i=0; i<collimator.getXdim(); i++) {
          cout << ref_plan[s][a][i] << endl;
          
        }
      }
    }
  }